

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GenerateAppleInfoPList
          (cmLocalGenerator *this,cmTarget *target,string *targetName,char *fname)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  char *local_1e0 [4];
  string inFile;
  string inMod;
  
  std::__cxx11::string::string((string *)&inMod,"MACOSX_BUNDLE_INFO_PLIST",(allocator *)&inFile);
  pcVar2 = cmTarget::GetProperty(target,&inMod);
  std::__cxx11::string::~string((string *)&inMod);
  if (pcVar2 == (char *)0x0) {
    pcVar4 = "MacOSXBundleInfo.plist.in";
  }
  else {
    pcVar4 = "MacOSXBundleInfo.plist.in";
    if (*pcVar2 != '\0') {
      pcVar4 = pcVar2;
    }
  }
  std::__cxx11::string::string((string *)&inFile,pcVar4,(allocator *)&inMod);
  bVar1 = cmsys::SystemTools::FileIsFullPath(inFile._M_dataplus._M_p);
  if (!bVar1) {
    cmMakefile::GetModulesFile_abi_cxx11_(&inMod,this->Makefile,inFile._M_dataplus._M_p);
    if (inMod._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&inFile);
    }
    std::__cxx11::string::~string((string *)&inMod);
  }
  bVar1 = cmsys::SystemTools::FileExists(inFile._M_dataplus._M_p,true);
  if (bVar1) {
    this_00 = this->Makefile;
    cmMakefile::PushScope(this_00);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_EXECUTABLE_NAME",(allocator *)local_1e0);
    cmMakefile::AddDefinition(this_00,&inMod,(targetName->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_INFO_STRING",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_BUNDLE_ICON_FILE",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_GUI_IDENTIFIER",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_LONG_VERSION_STRING",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_BUNDLE_NAME",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_SHORT_VERSION_STRING",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string
              ((string *)&inMod,"MACOSX_BUNDLE_BUNDLE_VERSION",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    std::__cxx11::string::string((string *)&inMod,"MACOSX_BUNDLE_COPYRIGHT",(allocator *)local_1e0);
    cmLGInfoProp(this_00,target,&inMod);
    std::__cxx11::string::~string((string *)&inMod);
    cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&inMod);
    cmMakefile::ConfigureFile
              (this_00,inFile._M_dataplus._M_p,fname,false,false,false,(cmNewLineStyle *)&inMod);
    cmMakefile::PopScope(this_00);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&inMod);
    poVar3 = std::operator<<((ostream *)&inMod,"Target ");
    poVar3 = std::operator<<(poVar3,(string *)&target->Name);
    poVar3 = std::operator<<(poVar3," Info.plist template \"");
    poVar3 = std::operator<<(poVar3,(string *)&inFile);
    std::operator<<(poVar3,"\" could not be found.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(local_1e0[0],(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inMod);
  }
  std::__cxx11::string::~string((string *)&inFile);
  return;
}

Assistant:

void cmLocalGenerator::GenerateAppleInfoPList(cmTarget* target,
                                              const std::string& targetName,
                                              const char* fname)
{
  // Find the Info.plist template.
  const char* in = target->GetProperty("MACOSX_BUNDLE_INFO_PLIST");
  std::string inFile = (in && *in)? in : "MacOSXBundleInfo.plist.in";
  if(!cmSystemTools::FileIsFullPath(inFile.c_str()))
    {
    std::string inMod = this->Makefile->GetModulesFile(inFile.c_str());
    if(!inMod.empty())
      {
      inFile = inMod;
      }
    }
  if(!cmSystemTools::FileExists(inFile.c_str(), true))
    {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \""
      << inFile << "\" could not be found.";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  mf->PushScope();
  mf->AddDefinition("MACOSX_BUNDLE_EXECUTABLE_NAME", targetName.c_str());
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_INFO_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_GUI_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_LONG_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_NAME");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_VERSION");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_COPYRIGHT");
  mf->ConfigureFile(inFile.c_str(), fname, false, false, false);
  mf->PopScope();
}